

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O2

EVaction INT_REVassoc_terminal_action
                   (CMConnection conn,EVstone stone,FMStructDescList format_list,char *handler)

{
  int condition;
  CMFormat format;
  EV_int_response response;
  int local_50;
  EVstone local_4c;
  char *local_48;
  char *local_40;
  undefined1 local_38 [4];
  EVaction local_34;
  
  condition = INT_CMCondition_get(conn->cm,conn);
  format = INT_CMlookup_format(conn->cm,EVassoc_terminal_action_req_formats);
  local_4c = stone;
  local_48 = get_format_name(conn->cm,format_list);
  local_50 = condition;
  local_40 = handler;
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EVassoc_terminal_action_req_formats);
  }
  INT_CMCondition_set_client_data(conn->cm,condition,local_38);
  INT_CMwrite(conn,format,&local_50);
  INT_CMCondition_wait(conn->cm,condition);
  return local_34;
}

Assistant:

extern EVaction
INT_REVassoc_terminal_action(CMConnection conn, EVstone stone, FMStructDescList format_list, char *handler)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVassoc_terminal_action_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVassoc_terminal_action_req_formats);
    request.stone = stone;
    request.format_list = get_format_name(conn->cm, format_list);
    request.handler = handler;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVassoc_terminal_action_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
    return (EVaction) response.ret;
}